

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  uint32_t begin;
  PatchList PVar1;
  Inst *pIVar2;
  byte in_DL;
  uint32_t in_ESI;
  Inst *in_RDI;
  int unaff_retaddr;
  Compiler *in_stack_00000008;
  int id;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  int out;
  undefined4 in_stack_ffffffffffffffd0;
  PatchList in_stack_ffffffffffffffd4;
  Frag local_8;
  
  begin = AllocInst(in_stack_00000008,unaff_retaddr);
  if ((int)begin < 0) {
    local_8 = NoMatch((Compiler *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    PODArray<re2::Prog::Inst>::operator[]
              ((PODArray<re2::Prog::Inst> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    Prog::Inst::InitAlt((Inst *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x235e45);
    PatchList::Patch(in_RDI,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc4);
    out = (int)((ulong)in_RDI >> 0x20);
    if ((in_DL & 1) == 0) {
      PODArray<re2::Prog::Inst>::operator[]
                ((PODArray<re2::Prog::Inst> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      Prog::Inst::set_out((Inst *)CONCAT44(in_stack_ffffffffffffffd4.p,in_stack_ffffffffffffffd0),
                          out);
      PVar1 = PatchList::Mk(begin << 1 | 1);
      Frag::Frag(&local_8,begin,PVar1);
    }
    else {
      pIVar2 = PODArray<re2::Prog::Inst>::operator[]
                         ((PODArray<re2::Prog::Inst> *)CONCAT44(in_stack_ffffffffffffffc4,in_ESI),
                          in_stack_ffffffffffffffbc);
      (pIVar2->field_1).out1_ = in_ESI;
      PVar1 = PatchList::Mk(begin << 1);
      Frag::Frag(&local_8,begin,PVar1);
    }
  }
  return local_8;
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitAlt(0, 0);
  PatchList::Patch(inst_.data(), a.end, id);
  if (nongreedy) {
    inst_[id].out1_ = a.begin;
    return Frag(id, PatchList::Mk(id << 1));
  } else {
    inst_[id].set_out(a.begin);
    return Frag(id, PatchList::Mk((id << 1) | 1));
  }
}